

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O2

int rnndec_varadd(rnndeccontext *ctx,char *varset,char *variant)

{
  int iVar1;
  int iVar2;
  rnnenum *prVar3;
  rnndecvariant *prVar4;
  rnndecvariant **pprVar5;
  ulong uVar6;
  ulong uVar7;
  
  prVar3 = rnn_findenum(ctx->db,varset);
  if (prVar3 == (rnnenum *)0x0) {
    fprintf(_stderr,"Enum %s doesn\'t exist in database!\n",varset);
  }
  else {
    uVar7 = 0;
    uVar6 = (ulong)(uint)prVar3->valsnum;
    if (prVar3->valsnum < 1) {
      uVar6 = uVar7;
    }
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      iVar2 = strcasecmp(prVar3->vals[uVar7]->name,variant);
      if (iVar2 == 0) {
        prVar4 = (rnndecvariant *)calloc(0x10,1);
        prVar4->en = prVar3;
        prVar4->variant = (int)uVar7;
        iVar2 = ctx->varsnum;
        iVar1 = ctx->varsmax;
        if (iVar2 < iVar1) {
          pprVar5 = ctx->vars;
        }
        else {
          iVar2 = 0x10;
          if (iVar1 != 0) {
            iVar2 = iVar1 * 2;
          }
          ctx->varsmax = iVar2;
          pprVar5 = (rnndecvariant **)realloc(ctx->vars,(long)iVar2 << 3);
          ctx->vars = pprVar5;
          iVar2 = ctx->varsnum;
        }
        ctx->varsnum = iVar2 + 1;
        pprVar5[iVar2] = prVar4;
        return 1;
      }
    }
    fprintf(_stderr,"Variant %s doesn\'t exist in enum %s!\n",variant,varset);
  }
  return 0;
}

Assistant:

int rnndec_varadd(struct rnndeccontext *ctx, char *varset, char *variant) {
	struct rnnenum *en = rnn_findenum(ctx->db, varset);
	if (!en) {
		fprintf (stderr, "Enum %s doesn't exist in database!\n", varset);
		return 0;
	}
	int i;
	for (i = 0; i < en->valsnum; i++)
		if (!strcasecmp(en->vals[i]->name, variant)) {
			struct rnndecvariant *ci = calloc (sizeof *ci, 1);
			ci->en = en;
			ci->variant = i;
			ADDARRAY(ctx->vars, ci);
			return 1;
		}
	fprintf (stderr, "Variant %s doesn't exist in enum %s!\n", variant, varset);
	return 0;
}